

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

void ImGui::ShrinkWidths(ImGuiShrinkWidthItem *items,int count,float width_excess)

{
  long lVar1;
  int in_ESI;
  long in_RDI;
  float in_XMM0_Da;
  float fVar2;
  float width_to_add;
  int n_1;
  float width_rounded;
  int n;
  int item_n;
  float width_to_remove_per_item;
  float max_width_to_remove_per_item;
  int count_same_width;
  _func_int_void_ptr_void_ptr *in_stack_ffffffffffffffb8;
  undefined7 in_stack_ffffffffffffffc0;
  undefined1 in_stack_ffffffffffffffc7;
  undefined4 in_stack_ffffffffffffffc8;
  undefined2 in_stack_ffffffffffffffcc;
  undefined1 in_stack_ffffffffffffffce;
  bool bVar3;
  undefined1 in_stack_ffffffffffffffcf;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  int iVar4;
  int local_24;
  int local_20;
  int local_14;
  float local_10;
  
  if (in_ESI == 1) {
    if (0.0 <= *(float *)(in_RDI + 4)) {
      fVar2 = ImMax<float>(*(float *)(in_RDI + 4) - in_XMM0_Da,1.0);
      *(float *)(in_RDI + 4) = fVar2;
    }
  }
  else {
    ImQsort((void *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
            CONCAT17(in_stack_ffffffffffffffcf,
                     CONCAT16(in_stack_ffffffffffffffce,
                              CONCAT24(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8))),
            CONCAT17(in_stack_ffffffffffffffc7,in_stack_ffffffffffffffc0),in_stack_ffffffffffffffb8)
    ;
    local_14 = 1;
    for (local_10 = in_XMM0_Da; 0.0 < local_10 && local_14 < in_ESI;
        local_10 = -fVar2 * (float)local_14 + local_10) {
      while( true ) {
        bVar3 = false;
        if (local_14 < in_ESI) {
          bVar3 = *(float *)(in_RDI + 4) <= *(float *)(in_RDI + (long)local_14 * 0xc + 4);
        }
        if (!bVar3) break;
        local_14 = local_14 + 1;
      }
      if ((in_ESI <= local_14) || (*(float *)(in_RDI + (long)local_14 * 0xc + 4) < 0.0)) {
        fVar2 = *(float *)(in_RDI + 4) - 1.0;
      }
      else {
        fVar2 = *(float *)(in_RDI + 4) - *(float *)(in_RDI + (long)local_14 * 0xc + 4);
      }
      if (fVar2 <= 0.0) break;
      fVar2 = ImMin<float>(local_10 / (float)local_14,fVar2);
      for (local_20 = 0; local_20 < local_14; local_20 = local_20 + 1) {
        lVar1 = in_RDI + (long)local_20 * 0xc;
        *(float *)(lVar1 + 4) = *(float *)(lVar1 + 4) - fVar2;
      }
    }
    local_10 = 0.0;
    for (local_24 = 0; local_24 < in_ESI; local_24 = local_24 + 1) {
      fVar2 = ImFloor(*(float *)(in_RDI + (long)local_24 * 0xc + 4));
      local_10 = (*(float *)(in_RDI + (long)local_24 * 0xc + 4) - fVar2) + local_10;
      *(float *)(in_RDI + (long)local_24 * 0xc + 4) = fVar2;
    }
    while (0.0 < local_10) {
      for (iVar4 = 0; iVar4 < in_ESI && 0.0 < local_10; iVar4 = iVar4 + 1) {
        fVar2 = ImMin<float>(*(float *)(in_RDI + (long)iVar4 * 0xc + 8) -
                             *(float *)(in_RDI + (long)iVar4 * 0xc + 4),1.0);
        lVar1 = in_RDI + (long)iVar4 * 0xc;
        *(float *)(lVar1 + 4) = fVar2 + *(float *)(lVar1 + 4);
        local_10 = local_10 - fVar2;
      }
    }
  }
  return;
}

Assistant:

void ImGui::ShrinkWidths(ImGuiShrinkWidthItem* items, int count, float width_excess)
{
    if (count == 1)
    {
        if (items[0].Width >= 0.0f)
            items[0].Width = ImMax(items[0].Width - width_excess, 1.0f);
        return;
    }
    ImQsort(items, (size_t)count, sizeof(ImGuiShrinkWidthItem), ShrinkWidthItemComparer);
    int count_same_width = 1;
    while (width_excess > 0.0f && count_same_width < count)
    {
        while (count_same_width < count && items[0].Width <= items[count_same_width].Width)
            count_same_width++;
        float max_width_to_remove_per_item = (count_same_width < count && items[count_same_width].Width >= 0.0f) ? (items[0].Width - items[count_same_width].Width) : (items[0].Width - 1.0f);
        if (max_width_to_remove_per_item <= 0.0f)
            break;
        float width_to_remove_per_item = ImMin(width_excess / count_same_width, max_width_to_remove_per_item);
        for (int item_n = 0; item_n < count_same_width; item_n++)
            items[item_n].Width -= width_to_remove_per_item;
        width_excess -= width_to_remove_per_item * count_same_width;
    }

    // Round width and redistribute remainder
    // Ensure that e.g. the right-most tab of a shrunk tab-bar always reaches exactly at the same distance from the right-most edge of the tab bar separator.
    width_excess = 0.0f;
    for (int n = 0; n < count; n++)
    {
        float width_rounded = ImFloor(items[n].Width);
        width_excess += items[n].Width - width_rounded;
        items[n].Width = width_rounded;
    }
    while (width_excess > 0.0f)
        for (int n = 0; n < count && width_excess > 0.0f; n++)
        {
            float width_to_add = ImMin(items[n].InitialWidth - items[n].Width, 1.0f);
            items[n].Width += width_to_add;
            width_excess -= width_to_add;
        }
}